

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

_Bool duckdb_je_background_threads_enable(tsd_t *tsd)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  long lVar3;
  size_t sVar4;
  background_thread_info_t *pbVar5;
  _Bool _Var6;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  uint i;
  ulong uVar10;
  undefined1 *puVar11;
  ulong uVar12;
  pthread_mutex_t *__mutex;
  undefined8 uStack_50;
  ulong local_48;
  uint local_3c;
  undefined1 *local_38;
  
  lVar3 = -(duckdb_je_max_background_threads + 0xf & 0xfffffffffffffff0);
  puVar11 = (undefined1 *)((long)&local_48 + lVar3);
  local_38 = puVar11;
  if (duckdb_je_max_background_threads != 0) {
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1179225;
    switchD_005700f1::default(puVar11,0,duckdb_je_max_background_threads);
  }
  *local_38 = 1;
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1179231;
  local_3c = duckdb_je_narenas_total_get();
  uVar9 = (ulong)local_3c;
  if (1 < local_3c) {
    uVar10 = 0;
    uVar12 = 1;
    puVar11 = local_38;
    local_48 = uVar9;
    do {
      pbVar5 = duckdb_je_background_thread_info;
      if (puVar11[uVar12 % duckdb_je_max_background_threads] == '\0') {
        pvVar8 = duckdb_je_arenas[uVar12].repr;
        if (pvVar8 == (void *)0x0) {
          pvVar8 = (void *)0x0;
        }
        if (pvVar8 != (void *)0x0) {
          uVar9 = uVar12 % duckdb_je_max_background_threads;
          __mutex = (pthread_mutex_t *)
                    ((long)&duckdb_je_background_thread_info[uVar9].mtx.field_0 + 0x48);
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x11792af;
          iVar7 = pthread_mutex_trylock(__mutex);
          if (iVar7 != 0) {
            *(undefined8 *)((long)&uStack_50 + lVar3) = 0x11792bc;
            duckdb_je_malloc_mutex_lock_slow(&pbVar5[uVar9].mtx);
            pbVar5[uVar9].mtx.field_0.field_0.locked.repr = true;
          }
          puVar1 = &pbVar5[uVar9].mtx.field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if (&(pbVar5[uVar9].mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
            pbVar5[uVar9].mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
            ppwVar2 = &pbVar5[uVar9].mtx.field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          pbVar5[uVar9].state = background_thread_started;
          pbVar5[uVar9].indefinite_sleep.repr = false;
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x11792f4;
          duckdb_je_nstime_init(&pbVar5[uVar9].next_wakeup,0);
          pbVar5[uVar9].npages_to_purge_new = 0;
          pbVar5[uVar9].tot_n_runs = 0;
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1179312;
          duckdb_je_nstime_copy(&pbVar5[uVar9].tot_sleep_time,&nstime_zero);
          duckdb_je_n_background_threads = duckdb_je_n_background_threads + 1;
          pbVar5[uVar9].mtx.field_0.field_0.locked.repr = false;
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1179329;
          pthread_mutex_unlock(__mutex);
          sVar4 = duckdb_je_max_background_threads;
          local_38[uVar12 % duckdb_je_max_background_threads] = 1;
          uVar10 = (ulong)((int)uVar10 + 1);
          puVar11 = local_38;
          uVar9 = local_48;
          if (sVar4 == uVar10) break;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x117936d;
  _Var6 = background_thread_create_locked(tsd,0);
  if (local_3c != 0 && !_Var6) {
    uVar10 = 0;
    do {
      pvVar8 = duckdb_je_arenas[uVar10].repr;
      if (pvVar8 == (void *)0x0) {
        pvVar8 = (void *)0x0;
      }
      if (pvVar8 != (void *)0x0) {
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x11793b9;
        duckdb_je_pa_shard_set_deferral_allowed
                  ((tsdn_t *)tsd,(pa_shard_t *)((long)pvVar8 + 0x29a8),true);
      }
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  return _Var6;
}

Assistant:

bool
background_threads_enable(tsd_t *tsd) {
	assert(n_background_threads == 0);
	assert(background_thread_enabled());
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	VARIABLE_ARRAY(bool, marked, max_background_threads);
	unsigned nmarked;
	for (size_t i = 0; i < max_background_threads; i++) {
		marked[i] = false;
	}
	nmarked = 0;
	/* Thread 0 is required and created at the end. */
	marked[0] = true;
	/* Mark the threads we need to create for thread 0. */
	unsigned narenas = narenas_total_get();
	for (unsigned i = 1; i < narenas; i++) {
		if (marked[i % max_background_threads] ||
		    arena_get(tsd_tsdn(tsd), i, false) == NULL) {
			continue;
		}
		background_thread_info_t *info = &background_thread_info[
		    i % max_background_threads];
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		assert(info->state == background_thread_stopped);
		background_thread_init(tsd, info);
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		marked[i % max_background_threads] = true;
		if (++nmarked == max_background_threads) {
			break;
		}
	}

	bool err = background_thread_create_locked(tsd, 0);
	if (err) {
		return true;
	}
	for (unsigned i = 0; i < narenas; i++) {
		arena_t *arena = arena_get(tsd_tsdn(tsd), i, false);
		if (arena != NULL) {
			pa_shard_set_deferral_allowed(tsd_tsdn(tsd),
			    &arena->pa_shard, true);
		}
	}
	return false;
}